

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O3

void __thiscall QUndoView::setGroup(QUndoView *this,QUndoGroup *group)

{
  long lVar1;
  int *piVar2;
  QUndoModel *this_00;
  long lVar3;
  QUndoStack *stack;
  QUndoGroup *pQVar4;
  char *pcVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QObject local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  lVar3 = *(long *)(lVar1 + 0x5c0);
  if (lVar3 == 0) {
    if (group != (QUndoGroup *)0x0) {
LAB_0065df7e:
      lVar3 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)group);
      goto LAB_0065df8a;
    }
  }
  else {
    if (*(int *)(lVar3 + 4) == 0) {
      pQVar4 = (QUndoGroup *)0x0;
    }
    else {
      pQVar4 = *(QUndoGroup **)(lVar1 + 0x5c8);
    }
    if (pQVar4 != group) {
      if ((*(int *)(lVar3 + 4) != 0) && (*(QObject **)(lVar1 + 0x5c8) != (QObject *)0x0)) {
        pQVar6 = *(QObject **)(lVar1 + 0x5c8);
        if (*(int *)(lVar3 + 4) == 0) {
          pQVar6 = (QObject *)0x0;
        }
        QObject::disconnect(pQVar6,"2activeStackChanged(QUndoStack*)",*(QObject **)(lVar1 + 0x5d0),
                            "1setStack(QUndoStack*)");
      }
      if (group != (QUndoGroup *)0x0) goto LAB_0065df7e;
      lVar3 = 0;
LAB_0065df8a:
      piVar2 = *(int **)(lVar1 + 0x5c0);
      *(long *)(lVar1 + 0x5c0) = lVar3;
      *(QUndoGroup **)(lVar1 + 0x5c8) = group;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          operator_delete(piVar2);
        }
        lVar3 = *(long *)(lVar1 + 0x5c0);
      }
      if (((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) || (*(char **)(lVar1 + 0x5c8) == (char *)0x0)
         ) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QUndoModel::setStack(*(QUndoModel **)(lVar1 + 0x5d0),(QUndoStack *)0x0);
          return;
        }
        goto LAB_0065e072;
      }
      pcVar5 = *(char **)(lVar1 + 0x5c8);
      if (*(int *)(lVar3 + 4) == 0) {
        pcVar5 = (char *)0x0;
      }
      QObject::connect(local_20,pcVar5,(QObject *)"2activeStackChanged(QUndoStack*)",
                       *(char **)(lVar1 + 0x5d0),0x6f8a66);
      QMetaObject::Connection::~Connection((Connection *)local_20);
      this_00 = *(QUndoModel **)(lVar1 + 0x5d0);
      stack = (QUndoStack *)QUndoGroup::activeStack();
      QUndoModel::setStack(this_00,stack);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0065e072:
  __stack_chk_fail();
}

Assistant:

void QUndoView::setGroup(QUndoGroup *group)
{
    Q_D(QUndoView);

    if (d->group == group)
        return;

    if (d->group != nullptr) {
        disconnect(d->group, SIGNAL(activeStackChanged(QUndoStack*)),
                d->model, SLOT(setStack(QUndoStack*)));
    }

    d->group = group;

    if (d->group != nullptr) {
        connect(d->group, SIGNAL(activeStackChanged(QUndoStack*)),
                d->model, SLOT(setStack(QUndoStack*)));
        d->model->setStack(d->group->activeStack());
    } else {
        d->model->setStack(nullptr);
    }
}